

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeIncrPopulate(IncrMerger *pIncr)

{
  int nData;
  i64 iStart;
  MergeEngine *pMVar1;
  PmaReader *pPVar2;
  undefined1 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  u64 v;
  long in_FS_OFFSET;
  PmaWriter writer;
  int local_6c;
  undefined1 *local_68;
  u8 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  sqlite3_file *psStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iStart = pIncr->iStartOff;
  pMVar1 = pIncr->pMerger;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  psStack_40 = (sqlite3_file *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  vdbePmaWriterInit(pIncr->aFile[1].pFd,(PmaWriter *)&local_68,pIncr->pTask->pSorter->pgsz,iStart);
  iVar5 = 0;
  while (puVar3 = local_48, iVar5 == 0) {
    pPVar2 = pMVar1->aReadr;
    iVar6 = pMVar1->aTree[1];
    if (pPVar2[iVar6].pFd == (sqlite3_file *)0x0) break;
    nData = pPVar2[iVar6].nKey;
    v = (u64)nData;
    lVar7 = (long)(int)puStack_50;
    iVar4 = sqlite3VarintLen(v);
    if (pIncr->mxSz + iStart < (long)(puVar3 + (long)iVar4 + lVar7 + v)) break;
    vdbePmaWriteVarint((PmaWriter *)&local_68,v);
    vdbePmaWriteBlob((PmaWriter *)&local_68,pPVar2[iVar6].aKey,nData);
    iVar5 = vdbeMergeEngineStep(pIncr->pMerger,&local_6c);
  }
  iVar6 = vdbePmaWriterFinish((PmaWriter *)&local_68,&pIncr->aFile[1].iEof);
  if (iVar5 != 0) {
    iVar6 = iVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbeIncrPopulate(IncrMerger *pIncr){
  int rc = SQLITE_OK;
  int rc2;
  i64 iStart = pIncr->iStartOff;
  SorterFile *pOut = &pIncr->aFile[1];
  SortSubtask *pTask = pIncr->pTask;
  MergeEngine *pMerger = pIncr->pMerger;
  PmaWriter writer;
  assert( pIncr->bEof==0 );

  vdbeSorterPopulateDebug(pTask, "enter");

  vdbePmaWriterInit(pOut->pFd, &writer, pTask->pSorter->pgsz, iStart);
  while( rc==SQLITE_OK ){
    int dummy;
    PmaReader *pReader = &pMerger->aReadr[ pMerger->aTree[1] ];
    int nKey = pReader->nKey;
    i64 iEof = writer.iWriteOff + writer.iBufEnd;

    /* Check if the output file is full or if the input has been exhausted.
    ** In either case exit the loop. */
    if( pReader->pFd==0 ) break;
    if( (iEof + nKey + sqlite3VarintLen(nKey))>(iStart + pIncr->mxSz) ) break;

    /* Write the next key to the output. */
    vdbePmaWriteVarint(&writer, nKey);
    vdbePmaWriteBlob(&writer, pReader->aKey, nKey);
    assert( pIncr->pMerger->pTask==pTask );
    rc = vdbeMergeEngineStep(pIncr->pMerger, &dummy);
  }

  rc2 = vdbePmaWriterFinish(&writer, &pOut->iEof);
  if( rc==SQLITE_OK ) rc = rc2;
  vdbeSorterPopulateDebug(pTask, "exit");
  return rc;
}